

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void SortByDistance(int *aIdx,int nIdx,RtreeDValue *aDistance,int *aSpare)

{
  int nIdx_00;
  int nIdx_01;
  int *aIdx_00;
  RtreeDValue fRight;
  RtreeDValue fLeft;
  int *aRight;
  int *aLeft;
  int nRight;
  int nLeft;
  int iRight;
  int iLeft;
  int *aSpare_local;
  RtreeDValue *aDistance_local;
  int nIdx_local;
  int *aIdx_local;
  
  if (1 < nIdx) {
    nLeft = 0;
    nRight = 0;
    nIdx_00 = nIdx / 2;
    nIdx_01 = nIdx - nIdx_00;
    aIdx_00 = aIdx + nIdx_00;
    SortByDistance(aIdx,nIdx_00,aDistance,aSpare);
    SortByDistance(aIdx_00,nIdx_01,aDistance,aSpare);
    memcpy(aSpare,aIdx,(long)nIdx_00 << 2);
    while (nLeft < nIdx_00 || nRight < nIdx_01) {
      if (nLeft == nIdx_00) {
        aIdx[nLeft + nRight] = aIdx_00[nRight];
        nRight = nRight + 1;
      }
      else if (nRight == nIdx_01) {
        aIdx[nLeft + nRight] = aSpare[nLeft];
        nLeft = nLeft + 1;
      }
      else if (aDistance[aIdx_00[nRight]] <= aDistance[aSpare[nLeft]]) {
        aIdx[nLeft + nRight] = aIdx_00[nRight];
        nRight = nRight + 1;
      }
      else {
        aIdx[nLeft + nRight] = aSpare[nLeft];
        nLeft = nLeft + 1;
      }
    }
  }
  return;
}

Assistant:

static void SortByDistance(
  int *aIdx, 
  int nIdx, 
  RtreeDValue *aDistance, 
  int *aSpare
){
  if( nIdx>1 ){
    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDistance(aLeft, nLeft, aDistance, aSpare);
    SortByDistance(aRight, nRight, aDistance, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;

    while( iLeft<nLeft || iRight<nRight ){
      if( iLeft==nLeft ){
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }else if( iRight==nRight ){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        RtreeDValue fLeft = aDistance[aLeft[iLeft]];
        RtreeDValue fRight = aDistance[aRight[iRight]];
        if( fLeft<fRight ){
          aIdx[iLeft+iRight] = aLeft[iLeft];
          iLeft++;
        }else{
          aIdx[iLeft+iRight] = aRight[iRight];
          iRight++;
        }
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue left = aDistance[aIdx[jj-1]];
        RtreeDValue right = aDistance[aIdx[jj]];
        assert( left<=right );
      }
    }
#endif
  }
}